

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LatencyEncodingSynapse.cpp
# Opt level: O0

void __thiscall LatencyEncodingSynapse::update(LatencyEncodingSynapse *this)

{
  long *plVar1;
  Logging *this_00;
  Index IVar2;
  Scalar *pSVar3;
  value_type pEVar4;
  reference ppEVar5;
  long in_RDI;
  double dVar6;
  double dVar7;
  double vs;
  double scaledValue;
  int j_1;
  int j;
  int i;
  EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_ffffffffffffff70;
  long in_stack_ffffffffffffff78;
  LatencyEncodingSynapse *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  int local_20;
  int local_10;
  int local_c;
  
  local_c = 0;
  do {
    if (*(int *)(in_RDI + 0x30) <= local_c) {
      return;
    }
    resetOutput(in_stack_ffffffffffffff80);
    local_10 = 0;
    while( true ) {
      IVar2 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                        (in_stack_ffffffffffffff70);
      if (IVar2 <= local_10) break;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      dVar7 = *pSVar3;
      dVar6 = Clock::getCurrentTime(*(Clock **)(in_RDI + 0x40));
      if (dVar6 < dVar7) {
LAB_0011c686:
        pEVar4 = (value_type)operator_new(0x18);
        NoEvent::NoEvent((NoEvent *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        ppEVar5 = std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
                            ((vector<Event_*,_std::allocator<Event_*>_> *)(in_RDI + 0x50),
                             (long)local_10);
        *ppEVar5 = pEVar4;
      }
      else {
        pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                            in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        if (*pSVar3 <= -1.0) goto LAB_0011c686;
        pEVar4 = (value_type)operator_new(0x28);
        SpikeEvent::SpikeEvent
                  ((SpikeEvent *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        ppEVar5 = std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
                            ((vector<Event_*,_std::allocator<Event_*>_> *)(in_RDI + 0x50),
                             (long)local_10);
        *ppEVar5 = pEVar4;
        ppEVar5 = std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
                            ((vector<Event_*,_std::allocator<Event_*>_> *)(in_RDI + 0x50),
                             (long)local_10);
        (**(*ppEVar5)->_vptr_Event)(0x4094500000000000);
        pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                            in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        *pSVar3 = -1.0;
      }
      plVar1 = *(long **)(in_RDI + 0x10);
      in_stack_ffffffffffffff94 = local_10;
      ppEVar5 = std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
                          ((vector<Event_*,_std::allocator<Event_*>_> *)(in_RDI + 0x50),
                           (long)local_10);
      (**(code **)(*plVar1 + 0x28))(plVar1,in_stack_ffffffffffffff94,*ppEVar5);
      this_00 = *(Logging **)(in_RDI + 0x48);
      ppEVar5 = std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
                          ((vector<Event_*,_std::allocator<Event_*>_> *)(in_RDI + 0x50),
                           (long)local_10);
      Logging::logEvent(this_00,in_RDI,local_10,(*ppEVar5)->type);
      local_10 = local_10 + 1;
    }
    in_stack_ffffffffffffff80 = *(LatencyEncodingSynapse **)(in_RDI + 0x38);
    dVar7 = Clock::getCurrentTime(*(Clock **)(in_RDI + 0x40));
    if ((double)in_stack_ffffffffffffff80 <= dVar7) {
      local_20 = 0;
      while( true ) {
        in_stack_ffffffffffffff78 = (long)local_20;
        IVar2 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                          (in_stack_ffffffffffffff70);
        if (IVar2 <= in_stack_ffffffffffffff78) break;
        ppEVar5 = std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
                            ((vector<Event_*,_std::allocator<Event_*>_> *)
                             (*(long *)(in_RDI + 8) + 8),(long)local_20);
        dVar7 = *(double *)(in_RDI + 0x38);
        dVar6 = helperFunctions::clamp
                          (((double)(*ppEVar5)[1]._vptr_Event * 0.8 + 0.1) *
                           **(double **)(in_RDI + 0x18),0.0,**(double **)(in_RDI + 0x18) * 0.9);
        in_stack_ffffffffffffff70 =
             (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(dVar7 + dVar6);
        pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                            in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        *pSVar3 = (Scalar)in_stack_ffffffffffffff70;
        local_20 = local_20 + 1;
      }
      *(double *)(in_RDI + 0x38) = **(double **)(in_RDI + 0x18) + *(double *)(in_RDI + 0x38);
    }
    local_c = local_c + 1;
  } while( true );
}

Assistant:

void LatencyEncodingSynapse::update() {
    for(int i = 0; i < inputSize; i++) {
        resetOutput();
        for(int j = 0; j < spikeTimes.size(); j++) {
            if(spikeTimes(j) <= clock->getCurrentTime() && spikeTimes(j) > -1) {
                output[j] = new SpikeEvent();
                output[j]->setWeight(1300.0);
                spikeTimes(j) = -1;
            }
            else {
                output[j] = new NoEvent();
            }
            to_population->setInput(j, output[j]);
            logger->logEvent((long)this, j, output[j]->type);
        }
        if(currentWindow <= clock->getCurrentTime()) {
            for(int j = 0; j < spikeTimes.size(); j++) {
                double scaledValue = 0.1 + static_cast<ValueEvent*>(from_population->output[j])->value * 0.8;
                double vs = scaledValue * param->window_length_s;
                spikeTimes(j) = currentWindow + helperFunctions::clamp(vs, 0, param->window_length_s*0.9);
            }
            currentWindow += param->window_length_s;
        }
    }
}